

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O2

ParameterError data_urlencode(GlobalConfig *global,char *nextarg,char **postp,size_t *lenp)

{
  ParameterError PVar1;
  CURLcode CVar2;
  char *pcVar3;
  FILE *__stream;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  byte *val;
  ulong uVar7;
  long lVar8;
  char cVar9;
  size_t len;
  char *local_68;
  size_t local_60;
  char **local_58;
  dynbuf dyn;
  
  pcVar3 = strchr(nextarg,0x3d);
  local_68 = (char *)0x0;
  local_60 = 0;
  local_58 = postp;
  if ((pcVar3 == (char *)0x0) && (pcVar3 = strchr(nextarg,0x40), pcVar3 == (char *)0x0)) {
    len = 0;
    val = (byte *)nextarg;
  }
  else {
    len = (long)pcVar3 - (long)nextarg;
    val = (byte *)(pcVar3 + 1);
    if (*pcVar3 == '@') {
      uVar5 = *val - 0x2d;
      if (uVar5 == 0) {
        uVar5 = (uint)(byte)pcVar3[2];
      }
      __stream = _stdin;
      if ((uVar5 != 0) && (__stream = fopen64((char *)val,"rb"), __stream == (FILE *)0x0)) {
        errorf(global,"Failed to open %s",val);
        return PARAM_READ_ERROR;
      }
      PVar1 = file2memory(&local_68,&local_60,(FILE *)__stream);
      if ((__stream != (FILE *)0x0) && (__stream != _stdin)) {
        fclose(__stream);
      }
      pcVar3 = local_68;
      if (PVar1 != PARAM_OK) {
        return PVar1;
      }
      goto LAB_001131c3;
    }
  }
  PVar1 = getstr(&local_68,(char *)val,true);
  pcVar3 = local_68;
  if (PVar1 != PARAM_OK) {
    return PVar1;
  }
  local_60 = strlen(local_68);
LAB_001131c3:
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strdup("");
    if (pcVar3 == (char *)0x0) {
      return PARAM_NO_MEM;
    }
    sVar4 = 0;
  }
  else {
    pcVar3 = (char *)curl_easy_escape(0,pcVar3,local_60 & 0xffffffff);
    free(local_68);
    local_68 = (char *)0x0;
    if (pcVar3 == (char *)0x0) {
      return PARAM_NO_MEM;
    }
    sVar4 = strlen(pcVar3);
    uVar7 = 0;
    for (uVar6 = 0; uVar6 < sVar4; uVar6 = uVar6 + lVar8) {
      if ((((pcVar3[uVar6] == '%') && (pcVar3[uVar6 + 1] == '2')) &&
          (lVar8 = 3, cVar9 = '+', pcVar3[uVar6 + 2] == '0')) ||
         (lVar8 = 1, cVar9 = pcVar3[uVar6], uVar7 != uVar6)) {
        pcVar3[uVar7] = cVar9;
      }
      uVar7 = uVar7 + 1;
    }
    pcVar3[uVar7] = '\0';
    if (len == 0) {
      sVar4 = strlen(pcVar3);
    }
    else {
      curlx_dyn_init(&dyn,0x1f400000);
      CVar2 = curlx_dyn_addn(&dyn,nextarg,len);
      if (((CVar2 != CURLE_OK) || (CVar2 = curlx_dyn_addn(&dyn,"=",1), CVar2 != CURLE_OK)) ||
         (CVar2 = curlx_dyn_add(&dyn,pcVar3), CVar2 != CURLE_OK)) {
        curl_free(pcVar3);
        return PARAM_NO_MEM;
      }
      curl_free(pcVar3);
      pcVar3 = curlx_dyn_ptr(&dyn);
      sVar4 = curlx_dyn_len(&dyn);
    }
  }
  *local_58 = pcVar3;
  *lenp = sVar4;
  return PARAM_OK;
}

Assistant:

static ParameterError data_urlencode(struct GlobalConfig *global,
                                     const char *nextarg,
                                     char **postp,
                                     size_t *lenp)
{
  /* [name]=[content], we encode the content part only
   * [name]@[filename]
   *
   * Case 2: we first load the file using that name and then encode
   * the content.
   */
  ParameterError err;
  const char *p = strchr(nextarg, '=');
  size_t nlen;
  char is_file;
  char *postdata = NULL;
  size_t size = 0;
  if(!p)
    /* there was no '=' letter, check for a '@' instead */
    p = strchr(nextarg, '@');
  if(p) {
    nlen = p - nextarg; /* length of the name part */
    is_file = *p++; /* pass the separator */
  }
  else {
    /* neither @ nor =, so no name and it is not a file */
    nlen = 0;
    is_file = 0;
    p = nextarg;
  }
  if('@' == is_file) {
    FILE *file;
    /* a '@' letter, it means that a filename or - (stdin) follows */
    if(!strcmp("-", p)) {
      file = stdin;
      CURL_SET_BINMODE(stdin);
    }
    else {
      file = fopen(p, "rb");
      if(!file) {
        errorf(global, "Failed to open %s", p);
        return PARAM_READ_ERROR;
      }
    }

    err = file2memory(&postdata, &size, file);

    if(file && (file != stdin))
      fclose(file);
    if(err)
      return err;
  }
  else {
    err = getstr(&postdata, p, ALLOW_BLANK);
    if(err)
      goto error;
    size = strlen(postdata);
  }

  if(!postdata) {
    /* no data from the file, point to a zero byte string to make this
       get sent as a POST anyway */
    postdata = strdup("");
    if(!postdata)
      return PARAM_NO_MEM;
    size = 0;
  }
  else {
    char *enc = curl_easy_escape(NULL, postdata, (int)size);
    curlx_safefree(postdata); /* no matter if it worked or not */
    if(enc) {
      char *n;
      replace_url_encoded_space_by_plus(enc);
      if(nlen > 0) { /* only append '=' if we have a name */
        struct curlx_dynbuf dyn;
        curlx_dyn_init(&dyn, MAX_DATAURLENCODE);
        if(curlx_dyn_addn(&dyn, nextarg, nlen) ||
           curlx_dyn_addn(&dyn, "=", 1) ||
           curlx_dyn_add(&dyn, enc)) {
          curl_free(enc);
          return PARAM_NO_MEM;
        }
        curl_free(enc);
        n = curlx_dyn_ptr(&dyn);
        size = curlx_dyn_len(&dyn);
      }
      else {
        n = enc;
        size = strlen(n);
      }
      postdata = n;
    }
    else
      return PARAM_NO_MEM;
  }
  *postp = postdata;
  *lenp = size;
  return PARAM_OK;
error:
  return err;
}